

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.cpp
# Opt level: O2

void test<std::vector<unsigned_long,std::allocator<unsigned_long>>>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *arities,size_t attempts)

{
  pointer puVar1;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> __first;
  pointer puVar2;
  vector<long,_std::allocator<long>_> numbers;
  allocator<char> local_89;
  _Vector_base<long,_std::allocator<long>_> local_88;
  default_constructor<std::set<long,_std::less<long>,_std::allocator<long>_>_> local_68;
  string local_48 [32];
  
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (long *)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  utility::read<std::vector<long,std::allocator<long>>>
            ((istream *)&std::cin,(vector<long,_std::allocator<long>_> *)&local_88);
  std::
  __sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_88._M_impl.super__Vector_impl_data._M_start,
             local_88._M_impl.super__Vector_impl_data._M_finish);
  __first = std::
            __unique<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (local_88._M_impl.super__Vector_impl_data._M_start,
                       local_88._M_impl.super__Vector_impl_data._M_finish);
  std::vector<long,_std::allocator<long>_>::erase
            ((vector<long,_std::allocator<long>_> *)&local_88,(const_iterator)__first._M_current,
             (const_iterator)local_88._M_impl.super__Vector_impl_data._M_finish);
  puVar1 = (arities->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar2 = (arities->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    local_68.name._M_dataplus._M_p = (pointer)*puVar2;
    test_one<std::vector<long,std::allocator<long>>,k_ary_constructor<long>>
              ((vector<long,_std::allocator<long>_> *)&local_88,attempts,
               (k_ary_constructor<long> *)&local_68);
  }
  std::__cxx11::string::string<std::allocator<char>>(local_48,"set",&local_89);
  std::__cxx11::string::string((string *)&local_68,local_48);
  test_one<std::vector<long,std::allocator<long>>,default_constructor<std::set<long,std::less<long>,std::allocator<long>>>>
            ((vector<long,_std::allocator<long>_> *)&local_88,attempts,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"flat_set",&local_89);
  std::__cxx11::string::string((string *)&local_68,local_48);
  test_one<std::vector<long,std::allocator<long>>,default_constructor<boost::container::flat_set<long,std::less<long>,void>>>
            ((vector<long,_std::allocator<long>_> *)&local_88,attempts,
             (default_constructor<boost::container::flat_set<long,_std::less<long>,_void>_> *)
             &local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"hash_set",&local_89);
  std::__cxx11::string::string((string *)&local_68,local_48);
  test_one<std::vector<long,std::allocator<long>>,default_constructor<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>>>
            ((vector<long,_std::allocator<long>_> *)&local_88,attempts,
             (default_constructor<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>
              *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string(local_48);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_88);
  return;
}

Assistant:

void test (const Container & arities, std::size_t attempts)
{
    using integer_type = std::int64_t;
    std::vector<integer_type> numbers;
    utility::read(std::cin, numbers);
    std::sort(numbers.begin(), numbers.end());
    numbers.erase(std::unique(numbers.begin(), numbers.end()), numbers.end());

    for (auto arity: arities)
    {
        test_one(numbers, attempts, k_ary_constructor<integer_type>(arity));
    }

    test_one(numbers, attempts, default_constructor<std::set<integer_type>>("set"));
    test_one(numbers, attempts, default_constructor<boost::container::flat_set<integer_type>>("flat_set"));
    test_one(numbers, attempts, default_constructor<std::unordered_set<integer_type>>("hash_set"));
}